

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.h
# Opt level: O1

Rectangle<int> __thiscall Rml::Rectangle<int>::Intersect(Rectangle<int> *this,Rectangle<int> other)

{
  Vector2i a;
  code *pcVar1;
  bool bVar2;
  Vector2i VVar3;
  Rectangle<int> RVar4;
  
  if (((((this->p1).x < (this->p0).x) || ((this->p1).y < (this->p0).y)) || (other.p1.x < other.p0.x)
      ) || (other.p1.y < other.p0.y)) {
    bVar2 = Assert("RMLUI_ASSERT(Valid() && other.Valid())",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Rectangle.h"
                   ,0x51);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  VVar3.x = (this->p0).x;
  VVar3.y = (this->p0).y;
  RVar4.p0 = Math::Max<Rml::Vector2<int>>(VVar3,other.p0);
  a.x = (this->p1).x;
  a.y = (this->p1).y;
  VVar3 = Math::Min<Rml::Vector2<int>>(a,other.p1);
  VVar3 = Math::Max<Rml::Vector2<int>>(RVar4.p0,VVar3);
  RVar4.p1.x = VVar3.x;
  RVar4.p1.y = VVar3.y;
  return RVar4;
}

Assistant:

Rectangle Intersect(Rectangle other) const
	{
		RMLUI_ASSERT(Valid() && other.Valid());
		Rectangle result{Math::Max(p0, other.p0), Math::Min(p1, other.p1)};
		result.p1 = Math::Max(result.p0, result.p1);
		return result;
	}